

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

bool __thiscall
TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::NextPair
          (TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_> *this,
          ConstPair **pair)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ConstPair *pCVar4;
  
  uVar3 = (ulong)this->Position;
  uVar1 = this->Map->Size;
  if (this->Position < uVar1) {
    pCVar4 = (ConstPair *)&this->Map->Nodes[uVar3].Pair;
    do {
      if (pCVar4[-1] != (ConstPair)0x1) {
        *pair = pCVar4;
        this->Position = (int)uVar3 + 1;
        return true;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      this->Position = uVar2;
      pCVar4 = pCVar4 + 2;
    } while (uVar2 < uVar1);
  }
  return false;
}

Assistant:

bool NextPair(typename MapType::ConstPair *&pair)
	{
		if (Position >= Map.Size)
		{
			return false;
		}
		do
		{
			if (!Map.Nodes[Position].IsNil())
			{
				pair = reinterpret_cast<typename MapType::Pair *>(&Map.Nodes[Position].Pair);
				Position += 1;
				return true;
			}
		} while (++Position < Map.Size);
		return false;
	}